

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFullTypeName(ParserImpl *this,string *name)

{
  size_type *psVar1;
  bool bVar2;
  bool bVar3;
  undefined1 local_58 [8];
  string part;
  
  part.field_2._8_8_ = name;
  bVar2 = ConsumeIdentifier(this,name);
  if (bVar2) {
    psVar1 = &part._M_string_length;
    do {
      local_58 = (undefined1  [8])psVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_58,".","");
      bVar2 = TryConsume(this,(string *)local_58);
      if (local_58 != (undefined1  [8])psVar1) {
        operator_delete((void *)local_58);
      }
      if (!bVar2) break;
      part._M_dataplus._M_p = (pointer)0x0;
      part._M_string_length._0_1_ = 0;
      local_58 = (undefined1  [8])psVar1;
      bVar3 = ConsumeIdentifier(this,(string *)local_58);
      if (bVar3) {
        std::__cxx11::string::append((char *)part.field_2._8_8_);
        std::__cxx11::string::_M_append((char *)part.field_2._8_8_,(ulong)local_58);
      }
      if (local_58 != (undefined1  [8])psVar1) {
        operator_delete((void *)local_58);
      }
    } while (bVar3);
    bVar2 = !bVar2;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ConsumeFullTypeName(std::string* name) {
    DO(ConsumeIdentifier(name));
    while (TryConsume(".")) {
      std::string part;
      DO(ConsumeIdentifier(&part));
      *name += ".";
      *name += part;
    }
    return true;
  }